

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer ppVar5;
  reference pvVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar7;
  reference piVar8;
  mapped_type *ppcVar9;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  string local_5c8 [32];
  ostringstream local_5a8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_428 [32];
  undefined1 local_408 [8];
  ostringstream cmCTestLog_msg_1;
  _Self local_290;
  _Self local_288;
  iterator d;
  value_type local_25c;
  undefined1 local_258 [4];
  int test;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  iterator iStack_1d0;
  int root;
  _Self local_1c8;
  iterator it;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestMultiProcessHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Checking test dependency graph...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x32b,pcVar4,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_1c8._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  while( true ) {
    iStack_1d0 = std::
                 map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 ::end(&(this->Tests).
                        super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                      );
    bVar2 = std::operator!=(&local_1c8,&stack0xfffffffffffffe30);
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_1c8);
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = ppVar5->first;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
    std::stack<int,std::deque<int,std::allocator<int>>>::
    stack<std::deque<int,std::allocator<int>>,void>
              ((stack<int,std::deque<int,std::allocator<int>>> *)local_258);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258,
               (value_type *)((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    while (bVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                             ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                         ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258);
      local_25c = *pvVar6;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258);
      pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node,&local_25c);
      d._M_node = (_Base_ptr)pVar10.first._M_node;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar7 = &std::
                  map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  ::operator[](&(this->Tests).
                                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                               ,&local_25c)->super_set<int,_std::less<int>,_std::allocator<int>_>;
        local_288._M_node =
             (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar7);
        while( true ) {
          psVar7 = &std::
                    map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    ::operator[](&(this->Tests).
                                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                 ,&local_25c)->super_set<int,_std::less<int>,_std::allocator<int>_>;
          local_290._M_node =
               (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar7);
          bVar2 = std::operator!=(&local_288,&local_290);
          if (!bVar2) break;
          piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&local_288);
          if (*piVar8 == visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
            poVar3 = std::operator<<((ostream *)local_408,
                                     "Error: a cycle exists in the test dependency graph for the test \""
                                    );
            ppcVar9 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&(this->Properties).
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)
                                    ((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    + 4));
            poVar3 = std::operator<<(poVar3,(string *)*ppcVar9);
            std::operator<<(poVar3,"\".\nPlease fix the cycle and run ctest again.\n");
            pcVar1 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x340,pcVar4,false);
            std::__cxx11::string::~string(local_428);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_006198b0;
          }
          piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&local_288);
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258,piVar8);
          std::_Rb_tree_const_iterator<int>::operator++(&local_288);
        }
      }
    }
    bVar2 = false;
LAB_006198b0:
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_258);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
    if (bVar2) goto LAB_00619a18;
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&local_1c8);
  }
  std::__cxx11::ostringstream::ostringstream(local_5a8);
  poVar3 = std::operator<<((ostream *)local_5a8,"Checking test dependency graph end");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x34a,pcVar4,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::ostringstream::~ostringstream(local_5a8);
  this_local._7_1_ = 1;
LAB_00619a18:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (TestMap::iterator it = this->Tests.begin(); it != this->Tests.end();
       ++it) {
    // DFS from each element to itself
    int root = it->first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (TestSet::iterator d = this->Tests[test].begin();
             d != this->Tests[test].end(); ++d) {
          if (*d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(*d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}